

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,write_wm_data>
          (xr_writer *this,undefined8 *container)

{
  wm_data *pwVar1;
  wm_data *wm;
  write_wm_data local_21;
  
  pwVar1 = (wm_data *)container[1];
  for (wm = (wm_data *)*container; wm != pwVar1; wm = wm + 1) {
    write_wm_data::operator()(&local_21,wm,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}